

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

void __thiscall ParserProbModelXML::SetISD(ParserProbModelXML *this)

{
  xmlNodeSetPtr pxVar1;
  undefined1 auVar2 [16];
  int iVar3;
  FSDist_COF *this_00;
  long lVar4;
  ostream *poVar5;
  xmlXPathObjectPtr pxVar6;
  long lVar7;
  char *__s;
  xmlNodePtr pxVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  pointer pdVar10;
  ulong uVar11;
  EParse *pEVar12;
  long *plVar13;
  _Base_ptr p_Var14;
  long *plVar15;
  ulong uVar16;
  ParserProbModelXML *this_01;
  bool bVar17;
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var [56];
  string factor_name;
  string CPD_type;
  stringstream xpath_ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  ParserProbModelXML *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [40];
  undefined1 local_238 [32];
  string local_218;
  undefined1 local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  undefined1 auVar18 [64];
  
  this_00 = (FSDist_COF *)operator_new(0x48);
  FSDist_COF::FSDist_COF
            (this_00,(MultiAgentDecisionProcessDiscreteFactoredStatesInterface *)
                     (&(this->_m_fDecPOMDP->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                       super_MultiAgentDecisionProcess.field_0x0 +
                     *(long *)(*(long *)&(this->_m_fDecPOMDP->
                                         super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                         super_MultiAgentDecisionProcess + -0x48)));
  lVar4 = (**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                 super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                 super_MultiAgentDecisionProcess + 0xa8))();
  if (lVar4 != 0) {
    uVar16 = 0;
    local_288 = this;
    do {
      lVar4 = (**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                     super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                     super_MultiAgentDecisionProcess + 200))
                        (this->_m_fDecPOMDP,uVar16 & 0xffffffff);
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c8,*(long *)(lVar4 + 8),
                 *(long *)(lVar4 + 0x10) + *(long *)(lVar4 + 8));
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,
                 "/ProbModelXML/ProbNet/Potentials/Potential[@role=\'conditionalProbability\']/Variables/Variable"
                 ,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[starts-with(@name, \"",0x15);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\") and @timeSlice=\'0\']",0x16);
      std::__cxx11::stringbuf::str();
      pxVar6 = GetNodesMatchingExpression
                         (this,(xmlChar *)local_2a8._M_dataplus._M_p,(xmlNodePtr)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if (pxVar6 == (xmlXPathObjectPtr)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Warning: Variable ",0x12);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_2c8._M_dataplus._M_p,
                            local_2c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," has no ISD. Setting to uniform. ",0x21);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
LAB_00457411:
        lVar4 = (**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                       super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                       super_MultiAgentDecisionProcess + 0xc0))
                          (this->_m_fDecPOMDP,uVar16 & 0xffffffff);
        auVar18._8_56_ = extraout_var;
        auVar18._0_8_ = extraout_XMM1_Qa;
        if (lVar4 != 0) {
          auVar2 = vcvtusi2ss_avx512f(auVar18._0_16_,lVar4);
          local_260._32_8_ = 1.0 / (double)auVar2._0_4_;
          lVar7 = 0;
          do {
            FSDist_COF::SetProbability(this_00,(Index)uVar16,(Index)lVar7,(double)local_260._32_8_);
            lVar7 = lVar7 + 1;
          } while (lVar4 != lVar7);
        }
      }
      else {
        pxVar1 = pxVar6->nodesetval;
        if (pxVar1->nodeNr < 1) {
          pxVar8 = *pxVar1->nodeTab;
        }
        else {
          lVar4 = 0;
          do {
            pxVar8 = pxVar1->nodeTab[lVar4];
            lVar7 = xmlChildElementCount(pxVar8->parent);
            if (lVar7 == 1) break;
            lVar4 = lVar4 + 1;
          } while (lVar4 < pxVar1->nodeNr);
        }
        lVar4 = xmlChildElementCount(pxVar8->parent);
        bVar17 = lVar4 != 1;
        if (bVar17) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Warning: Variable ",0x12);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_2c8._M_dataplus._M_p,
                              local_2c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," has no ISD. Setting to uniform. ",0x21);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
        }
        __s = (char *)xmlGetProp(pxVar8->parent->parent,"type");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,__s,(allocator<char> *)&local_280);
        iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
        if (iVar3 == 0) {
          pxVar8 = pxVar8->parent->parent;
          local_260._0_8_ = local_260 + 0x10;
          this_01 = (ParserProbModelXML *)local_260;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"Values","");
          pxVar8 = FindChild(this_01,pxVar8,(string *)local_260);
          if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
            operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
          }
          if (pxVar8 == (xmlNodePtr)0x0) {
            pEVar12 = (EParse *)__cxa_allocate_exception(0x28);
            std::operator+(&local_280,"Variable ",&local_2c8);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_280);
            local_1f8._0_8_ = *plVar13;
            p_Var14 = (_Base_ptr)(plVar13 + 2);
            if ((_Base_ptr)local_1f8._0_8_ == p_Var14) {
              local_1f8._16_8_ = *(undefined8 *)p_Var14;
              local_1f8._24_8_ = plVar13[3];
              local_1f8._0_8_ = (_Base_ptr)(local_1f8 + 0x10);
            }
            else {
              local_1f8._16_8_ = *(undefined8 *)p_Var14;
            }
            local_1f8._8_8_ = plVar13[1];
            *plVar13 = (long)p_Var14;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            EParse::EParse(pEVar12,(string *)local_1f8);
            __cxa_throw(pEVar12,&EParse::typeinfo,E::~E);
          }
          pvVar9 = ParseArray(local_288,pxVar8);
          pdVar10 = (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if ((pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish != pdVar10) {
            uVar11 = 0;
            do {
              FSDist_COF::SetProbability(this_00,(Index)uVar16,(Index)uVar11,pdVar10[uVar11]);
              uVar11 = uVar11 + 1;
              pdVar10 = (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
            } while (uVar11 < (ulong)((long)(pvVar9->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)pdVar10 >> 3));
          }
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
          if (iVar3 == 0) {
            bVar17 = true;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
            if (iVar3 == 0) {
              pEVar12 = (EParse *)__cxa_allocate_exception(0x28);
              std::operator+(&local_1d8,"At variable ",&local_2c8);
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_1d8);
              local_238._0_8_ = *plVar13;
              p_Var14 = (_Base_ptr)(plVar13 + 2);
              if ((_Base_ptr)local_238._0_8_ == p_Var14) {
                local_238._16_8_ = *(undefined8 *)p_Var14;
                local_238._24_8_ = plVar13[3];
                local_238._0_8_ = (_Base_ptr)(local_238 + 0x10);
              }
              else {
                local_238._16_8_ = *(undefined8 *)p_Var14;
              }
              local_238._8_8_ = plVar13[1];
              *plVar13 = (long)p_Var14;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              std::operator+(&local_280,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_238,&local_2a8);
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_280);
              local_218._M_dataplus._M_p = (pointer)*plVar13;
              plVar15 = plVar13 + 2;
              if ((long *)local_218._M_dataplus._M_p == plVar15) {
                local_218.field_2._M_allocated_capacity = *plVar15;
                local_218.field_2._8_8_ = plVar13[3];
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              }
              else {
                local_218.field_2._M_allocated_capacity = *plVar15;
              }
              local_218._M_string_length = plVar13[1];
              *plVar13 = (long)plVar15;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              EParse::EParse(pEVar12,&local_218);
              __cxa_throw(pEVar12,&EParse::typeinfo,E::~E);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        this = local_288;
        if (bVar17) goto LAB_00457411;
      }
      xmlXPathFreeObject(pxVar6);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      uVar16 = uVar16 + 1;
      uVar11 = (**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                      super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                      super_MultiAgentDecisionProcess + 0xa8))();
    } while (uVar16 < uVar11);
  }
  FSDist_COF::SanityCheck(this_00);
  (this->_m_fDecPOMDP->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_S.
  _m_initialStateDistribution = (FactoredStateDistribution *)this_00;
  return;
}

Assistant:

void ParserProbModelXML::SetISD()
{
    FSDist_COF* isd = new FSDist_COF(*_m_fDecPOMDP);
    for(size_t i = 0; i < _m_fDecPOMDP->GetNrStateFactors(); i++)
    {
        bool setUniform = false;
        string factor_name = _m_fDecPOMDP->GetStateFactorDiscrete(i)->GetName();
        stringstream xpath_ss; 
        xpath_ss << "/ProbModelXML/ProbNet/Potentials/Potential[@role='conditionalProbability']/Variables/Variable";
        xpath_ss << "[starts-with(@name, \"" << factor_name << "\") and @timeSlice='0']";
        xmlXPathObjectPtr isd_nodes = GetNodesMatchingExpression((xmlChar*) xpath_ss.str().c_str());
        if(isd_nodes == NULL)
        {
            cout << "Warning: Variable " << factor_name << " has no ISD. Setting to uniform. " << endl;
            setUniform = true;
        }
        else
        {
            xmlNodeSetPtr isd_nodeset = isd_nodes->nodesetval;
            xmlNodePtr isd_node = isd_nodeset->nodeTab[0];
            for(int j = 0; j < isd_nodeset->nodeNr; j++)
            {
                isd_node = isd_nodeset->nodeTab[j];
                xmlNodePtr p = isd_node->parent;
                if(xmlChildElementCount(p) == 1)
                    break; //ISD nodes are one-dimensional arrays
            }
            if(xmlChildElementCount(isd_node->parent) != 1)
            {
                cout << "Warning: Variable " << factor_name << " has no ISD. Setting to uniform. " << endl;
                setUniform = true;
            }
            string CPD_type = (char*) xmlGetProp(isd_node->parent->parent, (xmlChar*) "type"); //Potential
            if(CPD_type == "Table")
            {
                xmlNodePtr data_node = FindChild(isd_node->parent->parent, "Values");
                if(data_node == NULL)
                    throw EParse("Variable " + factor_name + " has an empty ISD");
                const vector<double>* dist = ParseArray(data_node);
                for(size_t j = 0; j < dist->size(); j++)
                {
                    isd->SetProbability(i, j, dist->at(j));
                }
            }
            else if(CPD_type == "Uniform")
            {
                setUniform = true;
            }
            else if(CPD_type == "Tree/ADD")
            {
                throw EParse("At variable " + factor_name + ": CPD type \"" + CPD_type + "\" not allowed for initial belief.");
            }
        }
        if(setUniform)
        {
            size_t n = _m_fDecPOMDP->GetNrValuesForFactor(i);
            for(size_t j = 0; j < n; j++)
            {
                isd->SetProbability(i, j, 1.0/(float) n);
            }
        }

        xmlXPathFreeObject (isd_nodes);
    }

    isd->SanityCheck();
    _m_fDecPOMDP->SetISD(isd);
  
    return;
}